

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

void __thiscall serial::Serial::flushOutput(Serial *this)

{
  ScopedWriteLock lock;
  ScopedWriteLock local_10;
  
  local_10.pimpl_ = this->pimpl_;
  SerialImpl::writeLock(local_10.pimpl_);
  SerialImpl::flushOutput(this->pimpl_);
  ScopedWriteLock::~ScopedWriteLock(&local_10);
  return;
}

Assistant:

void Serial::flushOutput ()
{
  ScopedWriteLock lock(this->pimpl_);
  pimpl_->flushOutput ();
}